

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_2i_ool_x86_64
               (TCGContext *tcg_ctx,uint32_t dofs,uint32_t aofs,TCGv_i64 c,uint32_t oprsz,
               uint32_t maxsz,int32_t data,gen_helper_gvec_2i *fn)

{
  uint32_t val;
  TCGv_i32 pTVar1;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  val = simd_desc_x86_64(oprsz,maxsz,data);
  pTVar1 = tcg_const_i32_x86_64(tcg_ctx,val);
  ret = tcg_temp_new_ptr(tcg_ctx);
  ret_00 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_x86_64(tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_i64_x86_64(tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(ulong)aofs);
  (*fn)(tcg_ctx,ret,ret_00,c,pTVar1);
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_2i_ool(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, TCGv_i64 c,
                         uint32_t oprsz, uint32_t maxsz, int32_t data,
                         gen_helper_gvec_2i *fn)
{
    TCGv_ptr a0, a1;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);

    fn(tcg_ctx, a0, a1, c, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_i32(tcg_ctx, desc);
}